

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileEqnStorage.cpp
# Opt level: O2

void __thiscall
TPZFileEqnStorage<long_double>::Store
          (TPZFileEqnStorage<long_double> *this,int ieq,int jeq,char *name)

{
  FILE *pFVar1;
  long lVar2;
  int iVar3;
  double (*__ptr) [100];
  long lVar4;
  bool bVar5;
  double dVar6;
  double local_cf0;
  int64_t fPos [5];
  double readvec [4] [100];
  
  pFVar1 = fopen(name,"wb");
  fPos[2] = 0;
  fPos[3] = 0;
  fPos[0] = 0;
  fPos[1] = 0;
  fPos[4] = 0;
  lVar2 = ftell(pFVar1);
  fwrite(fPos,8,5,pFVar1);
  lVar4 = 0;
  while (__ptr = readvec, lVar4 != 4) {
    readvec[0][0] = (double)ftell(pFVar1);
    fseek(pFVar1,lVar2 + lVar4 * 8,0);
    fwrite(__ptr,8,1,pFVar1);
    fseek(pFVar1,(long)readvec[0][0],0);
    lVar4 = lVar4 + 1;
    dVar6 = 0.0;
    iVar3 = 100;
    while (bVar5 = iVar3 != 0, iVar3 = iVar3 + -1, bVar5) {
      local_cf0 = dVar6 * 2.1 * (double)(int)lVar4;
      fwrite(&local_cf0,8,1,pFVar1);
      dVar6 = dVar6 + 1.0;
    }
  }
  fclose(pFVar1);
  pFVar1 = fopen(name,"rb");
  fread(fPos,8,5,pFVar1);
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    fseek(pFVar1,fPos[lVar2],0);
    fread(__ptr,8,100,pFVar1);
    __ptr = __ptr + 1;
  }
  return;
}

Assistant:

void TPZFileEqnStorage<TVar>::Store(int ieq, int jeq, const char *name){
	//Initial tests with C input output files !
	int loop_limit=100;// = jeq-ieq;
	int i;
	FILE *out_file = fopen(name,"wb");
	double number=2.1;
	double val = 0;
	int64_t fPos[5] = {0};
	int64_t firstpos = ftell(out_file);
	fwrite(fPos,sizeof(int64_t),5,out_file);
	double readvec[4][100];
	int iblock =0;
	int64_t sizereturn;
	sizereturn = 0;
	for(iblock=0; iblock<4; iblock++) {
		int64_t currentpos = ftell(out_file);
		fseek(out_file,firstpos+iblock*sizeof(int64_t),SEEK_SET);
		fwrite(&currentpos,sizeof(int64_t),1,out_file);
		fseek(out_file,currentpos,SEEK_SET);
		for(i=0;i<loop_limit;i++){
			val=number*i*(iblock+1);
			fwrite(&val, sizeof(double), 1, out_file);
		}
	}
	fclose(out_file);
	out_file = fopen(name,"rb");
	sizereturn = fread(fPos,sizeof(int64_t),5,out_file);
#ifdef PZDEBUG
	if (sizereturn != 5) DebugStop();
#endif
	for(iblock = 0; iblock<4; iblock++) {
		fseek(out_file,fPos[iblock],SEEK_SET);
		sizereturn = fread(readvec[iblock],sizeof(double),loop_limit,out_file);
#ifdef PZDEBUG
		if (sizereturn != loop_limit) DebugStop();
#endif
	}
}